

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O0

int __thiscall
Solution::clone(Solution *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  int iVar2;
  Solution *this_00;
  reference ppVVar3;
  undefined4 extraout_var;
  Solution *pSVar4;
  void *__child_stack_00;
  value_type local_40;
  Vehicle *local_38;
  Vehicle *vehicle;
  iterator __end1;
  iterator __begin1;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> *__range1;
  Solution *s;
  Solution *this_local;
  
  this_00 = (Solution *)operator_new(0x20);
  memset(this_00,0,0x20);
  Solution(this_00);
  pSVar4 = this_00;
  __end1 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&this->vehicles);
  vehicle = (Vehicle *)
            std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::end(&this->vehicles);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&vehicle);
    if (!bVar1) break;
    ppVVar3 = std::_List_iterator<Vehicle_*>::operator*(&__end1);
    local_38 = *ppVVar3;
    iVar2 = Vehicle::clone(local_38,(__fn *)this_00,__child_stack_00,(int)pSVar4,__arg);
    local_40 = (value_type)CONCAT44(extraout_var,iVar2);
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
              ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)this_00,&local_40);
    std::_List_iterator<Vehicle_*>::operator++(&__end1);
  }
  this_00->weight = this->weight;
  return (int)this_00;
}

Assistant:

Solution *Solution::clone() {
    auto s = new Solution();
    for (auto vehicle: this->vehicles) {
        s->vehicles.push_back(vehicle->clone(s));
    }
    s->weight = this->weight;
    return s;
}